

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O3

nghttp2_outbound_item * nghttp2_stream_next_outbound_item(nghttp2_stream *stream)

{
  nghttp2_outbound_item *pnVar1;
  nghttp2_stream *pnVar2;
  
  while ((pnVar1 = stream->item, pnVar1 == (nghttp2_outbound_item *)0x0 ||
         ((stream->flags & 0xc) != 0))) {
    stream = (nghttp2_stream *)nghttp2_pq_top(&stream->obq);
    if (stream == (nghttp2_stream *)0x0) {
      return (nghttp2_outbound_item *)0x0;
    }
  }
  for (pnVar2 = stream->dep_prev; pnVar2 != (nghttp2_stream *)0x0; pnVar2 = pnVar2->dep_prev) {
    pnVar2->descendant_last_cycle = stream->cycle;
    stream = pnVar2;
  }
  return pnVar1;
}

Assistant:

nghttp2_outbound_item *
nghttp2_stream_next_outbound_item(nghttp2_stream *stream) {
  nghttp2_pq_entry *ent;
  nghttp2_stream *si;

  for (;;) {
    if (stream_active(stream)) {
      /* Update ascendant's descendant_last_cycle here, so that we can
         assure that new stream is scheduled based on it. */
      for (si = stream; si->dep_prev; si = si->dep_prev) {
        si->dep_prev->descendant_last_cycle = si->cycle;
      }
      return stream->item;
    }
    ent = nghttp2_pq_top(&stream->obq);
    if (!ent) {
      return NULL;
    }
    stream = nghttp2_struct_of(ent, nghttp2_stream, pq_entry);
  }
}